

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prediction_scheme_normal_octahedron_decoding_transform.h
# Opt level: O0

Point2 __thiscall
draco::PredictionSchemeNormalOctahedronDecodingTransform<int>::ComputeOriginalValue
          (PredictionSchemeNormalOctahedronDecodingTransform<int> *this,Point2 *pred,Point2 *corr)

{
  bool bVar1;
  int32_t iVar2;
  int32_t iVar3;
  Scalar_conflict3 *pSVar4;
  Self *in_RDX;
  VectorD<unsigned_int,_2> *in_RSI;
  _Type in_RDI;
  bool pred_is_in_diamond;
  Point2 t;
  Point2 *orig;
  int *in_stack_ffffffffffffff38;
  int i;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  VectorD<unsigned_int,_2> *in_stack_ffffffffffffff48;
  array<int,_2UL> c0;
  undefined8 local_74;
  undefined8 local_38;
  
  c0._M_elems = in_RDI;
  PredictionSchemeNormalOctahedronTransformBase<int>::center_value
            ((PredictionSchemeNormalOctahedronTransformBase<int> *)0x21da9b);
  PredictionSchemeNormalOctahedronTransformBase<int>::center_value
            ((PredictionSchemeNormalOctahedronTransformBase<int> *)0x21daac);
  VectorD<int,_2>::VectorD
            ((VectorD<int,_2> *)in_RDX,(Scalar_conflict3 *)c0._M_elems,(Scalar_conflict3 *)in_RDI);
  VectorD<unsigned_int,2>::VectorD<int,2>
            ((VectorD<unsigned_int,_2> *)in_RDI,(VectorD<int,_2> *)in_stack_ffffffffffffff48);
  VectorD<unsigned_int,2>::VectorD<int,2>
            ((VectorD<unsigned_int,_2> *)in_RDI,(VectorD<int,_2> *)in_stack_ffffffffffffff48);
  VectorD<unsigned_int,_2>::operator-(in_RSI,in_RDX);
  VectorD<int,2>::VectorD<unsigned_int,2>((VectorD<int,_2> *)in_RDI,in_stack_ffffffffffffff48);
  *(undefined8 *)(in_RDX->v_)._M_elems = local_38;
  VectorD<int,_2>::operator[]
            ((VectorD<int,_2> *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
             (int)((ulong)in_stack_ffffffffffffff38 >> 0x20));
  VectorD<int,_2>::operator[]
            ((VectorD<int,_2> *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
             (int)((ulong)in_stack_ffffffffffffff38 >> 0x20));
  bVar1 = PredictionSchemeNormalOctahedronTransformBase<int>::IsInDiamond
                    ((PredictionSchemeNormalOctahedronTransformBase<int> *)
                     CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                     (int)((ulong)in_stack_ffffffffffffff38 >> 0x20),(int)in_stack_ffffffffffffff38)
  ;
  if (!bVar1) {
    in_stack_ffffffffffffff48 =
         (VectorD<unsigned_int,_2> *)
         VectorD<int,_2>::operator[]
                   ((VectorD<int,_2> *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40)
                    ,(int)((ulong)in_stack_ffffffffffffff38 >> 0x20));
    VectorD<int,_2>::operator[]
              ((VectorD<int,_2> *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
               (int)((ulong)in_stack_ffffffffffffff38 >> 0x20));
    PredictionSchemeNormalOctahedronTransformBase<int>::InvertDiamond
              ((PredictionSchemeNormalOctahedronTransformBase<int> *)
               CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
               in_stack_ffffffffffffff38,(int *)0x21db9e);
  }
  i = (int)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  VectorD<unsigned_int,2>::VectorD<int,2>
            ((VectorD<unsigned_int,_2> *)in_RDI,(VectorD<int,_2> *)in_stack_ffffffffffffff48);
  VectorD<unsigned_int,2>::VectorD<int,2>
            ((VectorD<unsigned_int,_2> *)in_RDI,(VectorD<int,_2> *)in_stack_ffffffffffffff48);
  VectorD<unsigned_int,_2>::operator+(in_RSI,in_RDX);
  VectorD<int,2>::VectorD<unsigned_int,2>((VectorD<int,_2> *)in_RDI,in_stack_ffffffffffffff48);
  VectorD<int,_2>::operator[]
            ((VectorD<int,_2> *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),i);
  iVar2 = PredictionSchemeNormalOctahedronTransformBase<int>::ModMax
                    ((PredictionSchemeNormalOctahedronTransformBase<int> *)
                     CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),i);
  pSVar4 = VectorD<int,_2>::operator[]
                     ((VectorD<int,_2> *)CONCAT44(in_stack_ffffffffffffff44,iVar2),i);
  *pSVar4 = iVar2;
  VectorD<int,_2>::operator[]((VectorD<int,_2> *)CONCAT44(in_stack_ffffffffffffff44,iVar2),i);
  iVar3 = PredictionSchemeNormalOctahedronTransformBase<int>::ModMax
                    ((PredictionSchemeNormalOctahedronTransformBase<int> *)
                     CONCAT44(in_stack_ffffffffffffff44,iVar2),i);
  pSVar4 = VectorD<int,_2>::operator[]((VectorD<int,_2> *)CONCAT44(iVar3,iVar2),i);
  *pSVar4 = iVar3;
  if (!bVar1) {
    pSVar4 = VectorD<int,_2>::operator[]((VectorD<int,_2> *)CONCAT44(iVar3,iVar2),i);
    VectorD<int,_2>::operator[]
              ((VectorD<int,_2> *)CONCAT44(iVar3,iVar2),(int)((ulong)pSVar4 >> 0x20));
    PredictionSchemeNormalOctahedronTransformBase<int>::InvertDiamond
              ((PredictionSchemeNormalOctahedronTransformBase<int> *)CONCAT44(iVar3,iVar2),pSVar4,
               (int *)0x21dc7b);
  }
  VectorD<unsigned_int,2>::VectorD<int,2>
            ((VectorD<unsigned_int,_2> *)in_RDI,(VectorD<int,_2> *)in_stack_ffffffffffffff48);
  VectorD<unsigned_int,2>::VectorD<int,2>
            ((VectorD<unsigned_int,_2> *)in_RDI,(VectorD<int,_2> *)in_stack_ffffffffffffff48);
  VectorD<unsigned_int,_2>::operator+(in_RSI,in_RDX);
  VectorD<int,2>::VectorD<unsigned_int,2>((VectorD<int,_2> *)in_RDI,in_stack_ffffffffffffff48);
  *(undefined8 *)in_RDI = local_74;
  return (Point2)(array<int,_2UL>)c0._M_elems;
}

Assistant:

Point2 ComputeOriginalValue(Point2 pred, const Point2 &corr) const {
    const Point2 t(this->center_value(), this->center_value());
    typedef typename std::make_unsigned<DataTypeT>::type UnsignedDataTypeT;
    typedef VectorD<UnsignedDataTypeT, 2> Point2u;

    // Perform the addition in unsigned type to avoid signed integer overflow.
    // Note that the result will be the same (for non-overflowing values).
    pred = Point2(Point2u(pred) - Point2u(t));

    const bool pred_is_in_diamond = this->IsInDiamond(pred[0], pred[1]);
    if (!pred_is_in_diamond) {
      this->InvertDiamond(&pred[0], &pred[1]);
    }

    // Perform the addition in unsigned type to avoid signed integer overflow.
    // Note that the result will be the same (for non-overflowing values).
    Point2 orig(Point2u(pred) + Point2u(corr));

    orig[0] = this->ModMax(orig[0]);
    orig[1] = this->ModMax(orig[1]);
    if (!pred_is_in_diamond) {
      this->InvertDiamond(&orig[0], &orig[1]);
    }

    // Perform the addition in unsigned type to avoid signed integer overflow.
    // Note that the result will be the same (for non-overflowing values).
    orig = Point2(Point2u(orig) + Point2u(t));
    return orig;
  }